

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

uint mjs::get_hex_value(int ch)

{
  char __c;
  bool bVar1;
  runtime_error *this;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_10;
  uint local_c;
  int ch_local;
  
  local_10 = ch;
  bVar1 = anon_unknown_2::is_digit(ch);
  if (bVar1) {
    local_c = local_10 - 0x30;
  }
  else if ((local_10 < 0x41) || (0x46 < local_10)) {
    if ((local_10 < 0x61) || (0x66 < local_10)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      __c = (char)local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,1,__c,&local_51);
      std::operator+(&local_30,"Invalid hex digit: ",&local_50);
      std::runtime_error::runtime_error(this,(string *)&local_30);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_c = local_10 - 0x57;
  }
  else {
    local_c = local_10 - 0x37;
  }
  return local_c;
}

Assistant:

unsigned get_hex_value(int ch) {
    if (is_digit(ch)) return ch - '0';
    if (ch >= 'A' && ch <= 'F') return ch - 'A' + 10;
    if (ch >= 'a' && ch <= 'f') return ch - 'a' + 10;
    throw std::runtime_error("Invalid hex digit: " + std::string(1, (char)ch));
}